

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_upgrade_tls(connectdata *conn)

{
  CURLcode local_1c;
  CURLcode result;
  smtp_conn *smtpc;
  connectdata *conn_local;
  
  local_1c = Curl_ssl_connect_nonblocking(conn,0,&(conn->proto).imapc.ssldone);
  if (local_1c == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_AUTHENTICATE) {
      state(conn,SMTP_UPGRADETLS);
    }
    if (((conn->proto).imapc.ssldone & 1U) != 0) {
      smtp_to_smtps(conn);
      local_1c = smtp_perform_ehlo(conn);
    }
  }
  return local_1c;
}

Assistant:

static CURLcode smtp_perform_upgrade_tls(struct connectdata *conn)
{
  /* Start the SSL connection */
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  CURLcode result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET,
                                                 &smtpc->ssldone);

  if(!result) {
    if(smtpc->state != SMTP_UPGRADETLS)
      state(conn, SMTP_UPGRADETLS);

    if(smtpc->ssldone) {
      smtp_to_smtps(conn);
      result = smtp_perform_ehlo(conn);
    }
  }

  return result;
}